

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

void __thiscall
Js::SourceTextModuleRecord::SetNamespace
          (SourceTextModuleRecord *this,ModuleNamespace *moduleNamespace)

{
  Type *addr;
  WriteBarrierPtr<void> *addr_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->localExportSlots).ptr == (WriteBarrierPtr<void> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x1c7,"(localExportSlots != nullptr)","localExportSlots != nullptr"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  addr = &(this->super_ModuleRecordBase).namespaceObject;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_ModuleRecordBase).namespaceObject.ptr = moduleNamespace;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  addr_00 = (this->localExportSlots).ptr + this->localSlotCount;
  Memory::Recycler::WBSetBit((char *)addr_00);
  addr_00->ptr = moduleNamespace;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  return;
}

Assistant:

void SourceTextModuleRecord::SetNamespace(ModuleNamespace* moduleNamespace)
    {
        Assert(localExportSlots != nullptr);
        __super::SetNamespace(moduleNamespace);
        localExportSlots[GetLocalExportSlotCount()] = moduleNamespace;
    }